

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::ShaderOperatorTests::init(ShaderOperatorTests *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  Context *pCVar2;
  Vec4 *pVVar3;
  bool bVar4;
  int i;
  int iVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *plVar8;
  TestNode *pTVar9;
  char *pcVar10;
  size_t sVar11;
  OperatorPerformanceCase *pOVar12;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  undefined4 *puVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  long *plVar17;
  DataType *pDVar18;
  uint uVar19;
  DataType DVar20;
  CaseType caseType;
  long lVar21;
  Precision PVar22;
  int i_1;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  InitialCalibrationStorage fragmentSubGroupCalibrationStorage;
  InitialCalibrationStorage vertexSubGroupCalibrationStorage;
  InitialCalibrationStorage shaderGroupCalibrationStorage;
  DataType paramTypes [3];
  DataType types [4];
  Vec4 attrSmall;
  Vec4 attrNegPos;
  Vec4 attrPos;
  ostringstream name;
  int in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  uint uVar26;
  char *local_318;
  TestNode *local_308;
  TestNode *local_300;
  undefined4 *local_2f8;
  long *plStack_2f0;
  undefined4 *local_2e8;
  long *plStack_2e0;
  allocator<char> local_2cb;
  allocator<char> local_2ca;
  allocator<char> local_2c9;
  long *local_2c8;
  long *plStack_2c0;
  long local_2b8;
  long lStack_2b0;
  TestNode *local_2a0;
  TestNode *local_298;
  anon_struct_24_3_2913736f *local_290;
  long *local_288;
  long local_280;
  long local_278;
  char *local_270;
  long *local_268 [2];
  long local_258 [2];
  undefined8 local_248;
  undefined4 local_240;
  DataType aDStack_23c [2];
  undefined8 local_234;
  undefined4 local_22c;
  long local_220;
  long *local_218;
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  Vec4 local_1d8;
  Vec4 local_1c8;
  Vec4 local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "binary_operator","Binary Operator Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar16 = 0;
  local_2a0 = (TestNode *)this;
  do {
    pTVar7 = (TestNode *)operator_new(0x70);
    local_280 = lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,((TestNode *)this)->m_testCtx,init::binaryOps[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_290 = init::binaryOps + lVar16;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    local_318 = (char *)0x0;
    local_298 = pTVar7;
    do {
      plVar8 = (long *)operator_new(4);
      *(undefined4 *)plVar8 = 1;
      plStack_2c0 = (long *)0x0;
      local_2c8 = plVar8;
      plStack_2c0 = (long *)operator_new(0x20);
      local_288 = plStack_2c0 + 1;
      *(undefined4 *)(plStack_2c0 + 1) = 0;
      *(undefined4 *)((long)plStack_2c0 + 0xc) = 0;
      *plStack_2c0 = (long)&PTR__SharedPtrState_021702e8;
      plStack_2c0[2] = (long)plVar8;
      *(undefined4 *)(plStack_2c0 + 1) = 1;
      *(undefined4 *)((long)plStack_2c0 + 0xc) = 1;
      pTVar9 = (TestNode *)operator_new(0x70);
      pcVar14 = "Vertex and fragment";
      if ((int)local_318 == 0) {
        pcVar14 = "Unexpected vertex";
      }
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,pcVar14 + 0xb,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar7,pTVar9);
      pcVar14 = local_290->op;
      local_270 = (char *)CONCAT71(local_270._1_7_,local_290->swizzle);
      lVar16 = 0;
      do {
        DVar20 = init::binaryOpTypes[lVar16];
        lVar21 = 0;
        local_278 = lVar16;
        do {
          PVar22 = *(Precision *)((long)init::precisions + lVar21);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar10 = glu::getPrecisionName(PVar22);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffcd8 +
                            (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x180);
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
          pcVar10 = glu::getDataTypeName(DVar20);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffcd8 +
                            (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x180);
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar11);
          }
          pOVar12 = (OperatorPerformanceCase *)operator_new(0x1d8);
          pCVar2 = (Context *)local_2a0[1]._vptr_TestNode;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
                    (pOVar12,pCVar2->m_testCtx,pCVar2->m_renderCtx,(char *)local_268[0],local_318,
                     (CaseType)&local_2c8,in_stack_fffffffffffffcd8,
                     (InitialCalibrationStorage *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          (pOVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__BinaryOpCase_021700f8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(pOVar12 + 1),pcVar14,(allocator<char> *)local_1f8);
          *(DataType *)&pOVar12[1].super_TestCase.super_TestNode.m_name.field_2 = DVar20;
          *(Precision *)((long)&pOVar12[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
               PVar22;
          pOVar12[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[8] = (char)local_270;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pOVar12);
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          lVar21 = lVar21 + 4;
        } while (lVar21 != 0xc);
        lVar16 = local_278 + 1;
      } while (lVar16 != 8);
      LOCK();
      *(int *)local_288 = (int)*local_288 + -1;
      UNLOCK();
      if ((int)*local_288 == 0) {
        local_2c8 = (long *)0x0;
        (**(code **)(*plStack_2c0 + 0x10))();
      }
      pTVar7 = local_298;
      this = (ShaderOperatorTests *)local_2a0;
      LOCK();
      piVar1 = (int *)((long)plStack_2c0 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (plStack_2c0 != (long *)0x0) {
          (**(code **)(*plStack_2c0 + 8))();
        }
        plStack_2c0 = (long *)0x0;
      }
      bVar25 = (int)local_318 == 0;
      local_318 = (char *)(ulong)((int)local_318 + 1);
    } while (bVar25);
    lVar16 = local_280 + 1;
  } while (lVar16 != 4);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"angle_and_trigonometry",
             "Built-In Angle and Trigonometry Function Performance Tests");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,((TestNode *)this)->m_testCtx,"exponential",
             "Built-In Exponential Function Performance Tests");
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,"common_functions",
             "Built-In Common Function Performance Tests");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,((TestNode *)this)->m_testCtx,"geometric",
             "Built-In Geometric Function Performance Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,((TestNode *)this)->m_testCtx,"matrix",
             "Built-In Matrix Function Performance Tests");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,((TestNode *)this)->m_testCtx,"float_compare",
             "Built-In Floating Point Comparison Function Performance Tests");
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,((TestNode *)this)->m_testCtx,"int_compare",
             "Built-In Integer Comparison Function Performance Tests");
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,((TestNode *)this)->m_testCtx,"bool_compare",
             "Built-In Boolean Comparison Function Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  tcu::TestNode::addChild((TestNode *)this,node_02);
  tcu::TestNode::addChild((TestNode *)this,node_03);
  local_1b8.m_data[0] = 2.3;
  local_1b8.m_data[1] = 1.9;
  local_1b8.m_data[2] = 0.8;
  local_1b8.m_data[3] = 0.7;
  local_1c8.m_data[0] = -1.3;
  local_1c8.m_data[1] = 2.5;
  local_1c8.m_data[2] = -3.5;
  local_1c8.m_data[3] = 4.3;
  local_1d8.m_data[0] = -0.9;
  local_1d8.m_data[1] = 0.8;
  local_1d8.m_data[2] = -0.4;
  local_1d8.m_data[3] = 0.2;
  if ((init()::functionCaseGroups == '\0') &&
     (iVar5 = __cxa_guard_acquire(&init()::functionCaseGroups), iVar5 != 0)) {
    init::functionCaseGroups[0].groupName = "radians";
    init::functionCaseGroups[0].func = "radians";
    init::functionCaseGroups[0].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0].types[2] = N;
    init::functionCaseGroups[0].types[3] = N;
    init::functionCaseGroups[0].attribute = &local_1c8;
    init::functionCaseGroups[0].modifyParamNdx = -1;
    init::functionCaseGroups[0].useNearlyConstantInputs = false;
    init::functionCaseGroups[0].booleanCase = false;
    init::functionCaseGroups[0].precMask = PRECMASK_ALL;
    init::functionCaseGroups[1].groupName = "degrees";
    init::functionCaseGroups[1].func = "degrees";
    init::functionCaseGroups[1].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[1].types[2] = N;
    init::functionCaseGroups[1].types[3] = N;
    init::functionCaseGroups[1].modifyParamNdx = -1;
    init::functionCaseGroups[1].useNearlyConstantInputs = false;
    init::functionCaseGroups[1].booleanCase = false;
    init::functionCaseGroups[1].precMask = PRECMASK_ALL;
    init::functionCaseGroups[2].groupName = "sin";
    init::functionCaseGroups[2].func = "sin";
    init::functionCaseGroups[2].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[2].types[2] = N;
    init::functionCaseGroups[2].types[3] = N;
    init::functionCaseGroups[2].modifyParamNdx = -1;
    init::functionCaseGroups[2].useNearlyConstantInputs = false;
    init::functionCaseGroups[2].booleanCase = false;
    init::functionCaseGroups[2].precMask = PRECMASK_ALL;
    init::functionCaseGroups[3].groupName = "cos";
    init::functionCaseGroups[3].func = "cos";
    init::functionCaseGroups[3].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[3].types[2] = N;
    init::functionCaseGroups[3].types[3] = N;
    init::functionCaseGroups[3].modifyParamNdx = -1;
    init::functionCaseGroups[3].useNearlyConstantInputs = false;
    init::functionCaseGroups[3].booleanCase = false;
    init::functionCaseGroups[3].precMask = PRECMASK_ALL;
    init::functionCaseGroups[4].groupName = "tan";
    init::functionCaseGroups[4].func = "tan";
    init::functionCaseGroups[4].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[4].types[2] = N;
    init::functionCaseGroups[4].types[3] = N;
    init::functionCaseGroups[4].modifyParamNdx = -1;
    init::functionCaseGroups[4].useNearlyConstantInputs = false;
    init::functionCaseGroups[4].booleanCase = false;
    init::functionCaseGroups[4].precMask = PRECMASK_ALL;
    init::functionCaseGroups[5].groupName = "asin";
    init::functionCaseGroups[5].func = "asin";
    init::functionCaseGroups[5].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[5].types[2] = N;
    init::functionCaseGroups[5].types[3] = N;
    init::functionCaseGroups[5].attribute = &local_1d8;
    init::functionCaseGroups[5].modifyParamNdx = -1;
    init::functionCaseGroups[5].useNearlyConstantInputs = true;
    init::functionCaseGroups[5].booleanCase = false;
    init::functionCaseGroups[5].precMask = PRECMASK_ALL;
    init::functionCaseGroups[6].groupName = "acos";
    init::functionCaseGroups[6].func = "acos";
    init::functionCaseGroups[6].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[6].types[2] = N;
    init::functionCaseGroups[6].types[3] = N;
    init::functionCaseGroups[6].modifyParamNdx = -1;
    init::functionCaseGroups[6].useNearlyConstantInputs = true;
    init::functionCaseGroups[6].booleanCase = false;
    init::functionCaseGroups[6].precMask = PRECMASK_ALL;
    init::functionCaseGroups[7].groupName = "atan2";
    init::functionCaseGroups[7].func = "atan";
    init::functionCaseGroups[7].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[7].types[2] = F;
    init::functionCaseGroups[7].types[3] = N;
    init::functionCaseGroups[7].modifyParamNdx = -1;
    init::functionCaseGroups[7].useNearlyConstantInputs = false;
    init::functionCaseGroups[7].booleanCase = false;
    init::functionCaseGroups[7].precMask = PRECMASK_ALL;
    init::functionCaseGroups[8].groupName = "atan";
    init::functionCaseGroups[8].func = "atan";
    init::functionCaseGroups[8].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[8].types[2] = N;
    init::functionCaseGroups[8].types[3] = N;
    init::functionCaseGroups[8].modifyParamNdx = -1;
    init::functionCaseGroups[8].useNearlyConstantInputs = false;
    init::functionCaseGroups[8].booleanCase = false;
    init::functionCaseGroups[8].precMask = PRECMASK_ALL;
    init::functionCaseGroups[9].groupName = "pow";
    init::functionCaseGroups[9].func = "pow";
    init::functionCaseGroups[9].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[9].types[2] = F;
    init::functionCaseGroups[9].types[3] = N;
    init::functionCaseGroups[9].attribute = &local_1b8;
    init::functionCaseGroups[9].modifyParamNdx = -1;
    init::functionCaseGroups[9].useNearlyConstantInputs = false;
    init::functionCaseGroups[9].booleanCase = false;
    init::functionCaseGroups[9].precMask = PRECMASK_ALL;
    init::functionCaseGroups[10].groupName = "exp";
    init::functionCaseGroups[10].func = "exp";
    init::functionCaseGroups[10].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[10].types[2] = N;
    init::functionCaseGroups[10].types[3] = N;
    init::functionCaseGroups[10].modifyParamNdx = -1;
    init::functionCaseGroups[10].useNearlyConstantInputs = false;
    init::functionCaseGroups[10].booleanCase = false;
    init::functionCaseGroups[10].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xb].groupName = "log";
    init::functionCaseGroups[0xb].func = "log";
    init::functionCaseGroups[0xb].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xb].types[2] = N;
    init::functionCaseGroups[0xb].types[3] = N;
    init::functionCaseGroups[0xb].modifyParamNdx = -1;
    init::functionCaseGroups[0xb].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xb].booleanCase = false;
    init::functionCaseGroups[0xb].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xc].groupName = "exp2";
    init::functionCaseGroups[0xc].func = "exp2";
    init::functionCaseGroups[0xc].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xc].types[2] = N;
    init::functionCaseGroups[0xc].types[3] = N;
    init::functionCaseGroups[0xc].modifyParamNdx = -1;
    init::functionCaseGroups[0xc].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xc].booleanCase = false;
    init::functionCaseGroups[0xc].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xd].groupName = "log2";
    init::functionCaseGroups[0xd].func = "log2";
    init::functionCaseGroups[0xd].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xd].types[2] = N;
    init::functionCaseGroups[0xd].types[3] = N;
    init::functionCaseGroups[0xd].modifyParamNdx = -1;
    init::functionCaseGroups[0xd].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xd].booleanCase = false;
    init::functionCaseGroups[0xd].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xe].groupName = "sqrt";
    init::functionCaseGroups[0xe].func = "sqrt";
    init::functionCaseGroups[0xe].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xe].types[2] = N;
    init::functionCaseGroups[0xe].types[3] = N;
    init::functionCaseGroups[0xe].modifyParamNdx = -1;
    init::functionCaseGroups[0xe].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xe].booleanCase = false;
    init::functionCaseGroups[0xe].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xf].groupName = "inversesqrt";
    init::functionCaseGroups[0xf].func = "inversesqrt";
    init::functionCaseGroups[0xf].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xf].types[2] = N;
    init::functionCaseGroups[0xf].types[3] = N;
    init::functionCaseGroups[0xf].modifyParamNdx = -1;
    init::functionCaseGroups[0xf].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xf].booleanCase = false;
    init::functionCaseGroups[0xf].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x10].groupName = "abs";
    init::functionCaseGroups[0x10].func = "abs";
    init::functionCaseGroups[0x10].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x10].types[2] = N;
    init::functionCaseGroups[0x10].types[3] = N;
    init::functionCaseGroups[0x10].modifyParamNdx = -1;
    init::functionCaseGroups[0x10].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x10].booleanCase = false;
    init::functionCaseGroups[0x10].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x11].groupName = "abs";
    init::functionCaseGroups[0x11].func = "abs";
    init::functionCaseGroups[0x11].types[0] = V4;
    init::functionCaseGroups[0x11].types[1] = V4;
    init::functionCaseGroups[0x11].types[2] = N;
    init::functionCaseGroups[0x11].types[3] = N;
    init::functionCaseGroups[0x11].modifyParamNdx = -1;
    init::functionCaseGroups[0x11].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x11].booleanCase = false;
    init::functionCaseGroups[0x11].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x12].groupName = "sign";
    init::functionCaseGroups[0x12].func = "sign";
    init::functionCaseGroups[0x12].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x12].types[2] = N;
    init::functionCaseGroups[0x12].types[3] = N;
    init::functionCaseGroups[0x12].modifyParamNdx = -1;
    init::functionCaseGroups[0x12].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x12].booleanCase = false;
    init::functionCaseGroups[0x12].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x13].groupName = "sign";
    init::functionCaseGroups[0x13].func = "sign";
    init::functionCaseGroups[0x13].types[0] = V4;
    init::functionCaseGroups[0x13].types[1] = V4;
    init::functionCaseGroups[0x13].types[2] = N;
    init::functionCaseGroups[0x13].types[3] = N;
    init::functionCaseGroups[0x13].modifyParamNdx = -1;
    init::functionCaseGroups[0x13].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x13].booleanCase = false;
    init::functionCaseGroups[0x13].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x14].groupName = "floor";
    init::functionCaseGroups[0x14].func = "floor";
    init::functionCaseGroups[0x14].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x14].types[2] = N;
    init::functionCaseGroups[0x14].types[3] = N;
    init::functionCaseGroups[0x14].modifyParamNdx = -1;
    init::functionCaseGroups[0x14].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x14].booleanCase = false;
    init::functionCaseGroups[0x14].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x15].groupName = "floor";
    init::functionCaseGroups[0x15].func = "floor";
    init::functionCaseGroups[0x15].types[0] = V4;
    init::functionCaseGroups[0x15].types[1] = V4;
    init::functionCaseGroups[0x15].types[2] = N;
    init::functionCaseGroups[0x15].types[3] = N;
    init::functionCaseGroups[0x15].modifyParamNdx = -1;
    init::functionCaseGroups[0x15].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x15].booleanCase = false;
    init::functionCaseGroups[0x15].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x16].groupName = "ceil";
    init::functionCaseGroups[0x16].func = "ceil";
    init::functionCaseGroups[0x16].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x16].types[2] = N;
    init::functionCaseGroups[0x16].types[3] = N;
    init::functionCaseGroups[0x16].modifyParamNdx = -1;
    init::functionCaseGroups[0x16].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x16].booleanCase = false;
    init::functionCaseGroups[0x16].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x17].groupName = "ceil";
    init::functionCaseGroups[0x17].func = "ceil";
    init::functionCaseGroups[0x17].types[0] = V4;
    init::functionCaseGroups[0x17].types[1] = V4;
    init::functionCaseGroups[0x17].types[2] = N;
    init::functionCaseGroups[0x17].types[3] = N;
    init::functionCaseGroups[0x17].modifyParamNdx = -1;
    init::functionCaseGroups[0x17].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x17].booleanCase = false;
    init::functionCaseGroups[0x17].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x18].groupName = "fract";
    init::functionCaseGroups[0x18].func = "fract";
    init::functionCaseGroups[0x18].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x18].types[2] = N;
    init::functionCaseGroups[0x18].types[3] = N;
    init::functionCaseGroups[0x18].modifyParamNdx = -1;
    init::functionCaseGroups[0x18].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x18].booleanCase = false;
    init::functionCaseGroups[0x18].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x19].groupName = "fract";
    init::functionCaseGroups[0x19].func = "fract";
    init::functionCaseGroups[0x19].types[0] = V4;
    init::functionCaseGroups[0x19].types[1] = V4;
    init::functionCaseGroups[0x19].types[2] = N;
    init::functionCaseGroups[0x19].types[3] = N;
    init::functionCaseGroups[0x19].modifyParamNdx = -1;
    init::functionCaseGroups[0x19].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x19].booleanCase = false;
    init::functionCaseGroups[0x19].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1a].groupName = "mod";
    init::functionCaseGroups[0x1a].func = "mod";
    init::functionCaseGroups[0x1a].types[0] = GT;
    init::functionCaseGroups[0x1a].types[1] = GT;
    init::functionCaseGroups[0x1a].types[2] = GT;
    init::functionCaseGroups[0x1a].types[3] = N;
    init::functionCaseGroups[0x1a].modifyParamNdx = -1;
    init::functionCaseGroups[0x1a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1a].booleanCase = false;
    init::functionCaseGroups[0x1a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1b].groupName = "min";
    init::functionCaseGroups[0x1b].func = "min";
    init::functionCaseGroups[0x1b].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x1b].types[2] = F;
    init::functionCaseGroups[0x1b].types[3] = N;
    init::functionCaseGroups[0x1b].modifyParamNdx = -1;
    init::functionCaseGroups[0x1b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1b].booleanCase = false;
    init::functionCaseGroups[0x1b].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1c].groupName = "min";
    init::functionCaseGroups[0x1c].func = "min";
    init::functionCaseGroups[0x1c].types[0] = V4;
    init::functionCaseGroups[0x1c].types[1] = V4;
    init::functionCaseGroups[0x1c].types[2] = V4;
    init::functionCaseGroups[0x1c].types[3] = N;
    init::functionCaseGroups[0x1c].modifyParamNdx = -1;
    init::functionCaseGroups[0x1c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1c].booleanCase = false;
    init::functionCaseGroups[0x1c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1d].groupName = "max";
    init::functionCaseGroups[0x1d].func = "max";
    init::functionCaseGroups[0x1d].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x1d].types[2] = F;
    init::functionCaseGroups[0x1d].types[3] = N;
    init::functionCaseGroups[0x1d].modifyParamNdx = -1;
    init::functionCaseGroups[0x1d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1d].booleanCase = false;
    init::functionCaseGroups[0x1d].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1e].groupName = "max";
    init::functionCaseGroups[0x1e].func = "max";
    init::functionCaseGroups[0x1e].types[0] = V4;
    init::functionCaseGroups[0x1e].types[1] = V4;
    init::functionCaseGroups[0x1e].types[2] = V4;
    init::functionCaseGroups[0x1e].types[3] = N;
    init::functionCaseGroups[0x1e].modifyParamNdx = -1;
    init::functionCaseGroups[0x1e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1e].booleanCase = false;
    init::functionCaseGroups[0x1e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1f].groupName = "clamp";
    init::functionCaseGroups[0x1f].func = "clamp";
    init::functionCaseGroups[0x1f].types[0] = F;
    init::functionCaseGroups[0x1f].types[1] = F;
    init::functionCaseGroups[0x1f].types[2] = F;
    init::functionCaseGroups[0x1f].types[3] = F;
    init::functionCaseGroups[0x1f].modifyParamNdx = 2;
    init::functionCaseGroups[0x1f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1f].booleanCase = false;
    init::functionCaseGroups[0x1f].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x20].groupName = "clamp";
    init::functionCaseGroups[0x20].func = "clamp";
    init::functionCaseGroups[0x20].types[0] = V4;
    init::functionCaseGroups[0x20].types[1] = V4;
    init::functionCaseGroups[0x20].types[2] = V4;
    init::functionCaseGroups[0x20].types[3] = V4;
    init::functionCaseGroups[0x20].modifyParamNdx = 2;
    init::functionCaseGroups[0x20].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x20].booleanCase = false;
    init::functionCaseGroups[0x20].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x21].groupName = "mix";
    init::functionCaseGroups[0x21].func = "mix";
    init::functionCaseGroups[0x21].types[0] = F;
    init::functionCaseGroups[0x21].types[1] = F;
    init::functionCaseGroups[0x21].types[2] = F;
    init::functionCaseGroups[0x21].types[3] = F;
    init::functionCaseGroups[0x21].modifyParamNdx = -1;
    init::functionCaseGroups[0x21].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x21].booleanCase = false;
    init::functionCaseGroups[0x21].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x22].groupName = "mix";
    init::functionCaseGroups[0x22].func = "mix";
    init::functionCaseGroups[0x22].types[0] = V4;
    init::functionCaseGroups[0x22].types[1] = V4;
    init::functionCaseGroups[0x22].types[2] = V4;
    init::functionCaseGroups[0x22].types[3] = V4;
    init::functionCaseGroups[0x22].modifyParamNdx = -1;
    init::functionCaseGroups[0x22].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x22].booleanCase = false;
    init::functionCaseGroups[0x22].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x23].groupName = "step";
    init::functionCaseGroups[0x23].func = "step";
    init::functionCaseGroups[0x23].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x23].types[2] = F;
    init::functionCaseGroups[0x23].types[3] = N;
    init::functionCaseGroups[0x23].modifyParamNdx = -1;
    init::functionCaseGroups[0x23].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x23].booleanCase = false;
    init::functionCaseGroups[0x23].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x24].groupName = "step";
    init::functionCaseGroups[0x24].func = "step";
    init::functionCaseGroups[0x24].types[0] = V4;
    init::functionCaseGroups[0x24].types[1] = V4;
    init::functionCaseGroups[0x24].types[2] = V4;
    init::functionCaseGroups[0x24].types[3] = N;
    init::functionCaseGroups[0x24].modifyParamNdx = -1;
    init::functionCaseGroups[0x24].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x24].booleanCase = false;
    init::functionCaseGroups[0x24].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x25].groupName = "smoothstep";
    init::functionCaseGroups[0x25].func = "smoothstep";
    init::functionCaseGroups[0x25].types[0] = F;
    init::functionCaseGroups[0x25].types[1] = F;
    init::functionCaseGroups[0x25].types[2] = F;
    init::functionCaseGroups[0x25].types[3] = F;
    init::functionCaseGroups[0x25].modifyParamNdx = 1;
    init::functionCaseGroups[0x25].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x25].booleanCase = false;
    init::functionCaseGroups[0x25].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x26].groupName = "smoothstep";
    init::functionCaseGroups[0x26].func = "smoothstep";
    init::functionCaseGroups[0x26].types[0] = V4;
    init::functionCaseGroups[0x26].types[1] = V4;
    init::functionCaseGroups[0x26].types[2] = V4;
    init::functionCaseGroups[0x26].types[3] = V4;
    init::functionCaseGroups[0x26].modifyParamNdx = 1;
    init::functionCaseGroups[0x26].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x26].booleanCase = false;
    init::functionCaseGroups[0x26].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x27].groupName = "length";
    init::functionCaseGroups[0x27].func = "length";
    init::functionCaseGroups[0x27].types[0] = F;
    init::functionCaseGroups[0x27].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x27].types[2] = N;
    init::functionCaseGroups[0x27].types[3] = N;
    init::functionCaseGroups[0x27].modifyParamNdx = -1;
    init::functionCaseGroups[0x27].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x27].booleanCase = false;
    init::functionCaseGroups[0x27].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x28].groupName = "distance";
    init::functionCaseGroups[0x28].func = "distance";
    init::functionCaseGroups[0x28].types[0] = F;
    init::functionCaseGroups[0x28].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x28].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x28].types[3] = N;
    init::functionCaseGroups[0x28].modifyParamNdx = -1;
    init::functionCaseGroups[0x28].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x28].booleanCase = false;
    init::functionCaseGroups[0x28].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x29].groupName = "dot";
    init::functionCaseGroups[0x29].func = "dot";
    init::functionCaseGroups[0x29].types[0] = F;
    init::functionCaseGroups[0x29].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x29].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x29].types[3] = N;
    init::functionCaseGroups[0x29].modifyParamNdx = -1;
    init::functionCaseGroups[0x29].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x29].booleanCase = false;
    init::functionCaseGroups[0x29].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2a].groupName = "cross";
    init::functionCaseGroups[0x2a].func = "cross";
    init::functionCaseGroups[0x2a].types[0] = V3;
    init::functionCaseGroups[0x2a].types[1] = V3;
    init::functionCaseGroups[0x2a].types[2] = V3;
    init::functionCaseGroups[0x2a].types[3] = N;
    init::functionCaseGroups[0x2a].modifyParamNdx = -1;
    init::functionCaseGroups[0x2a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2a].booleanCase = false;
    init::functionCaseGroups[0x2a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2b].groupName = "normalize";
    init::functionCaseGroups[0x2b].func = "normalize";
    init::functionCaseGroups[0x2b].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2b].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2b].types[2] = N;
    init::functionCaseGroups[0x2b].types[3] = N;
    init::functionCaseGroups[0x2b].modifyParamNdx = -1;
    init::functionCaseGroups[0x2b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2b].booleanCase = false;
    init::functionCaseGroups[0x2b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2c].groupName = "faceforward";
    init::functionCaseGroups[0x2c].func = "faceforward";
    init::functionCaseGroups[0x2c].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2c].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2c].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2c].types[3] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2c].modifyParamNdx = -1;
    init::functionCaseGroups[0x2c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2c].booleanCase = false;
    init::functionCaseGroups[0x2c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2d].groupName = "reflect";
    init::functionCaseGroups[0x2d].func = "reflect";
    init::functionCaseGroups[0x2d].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2d].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2d].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2d].types[3] = N;
    init::functionCaseGroups[0x2d].modifyParamNdx = -1;
    init::functionCaseGroups[0x2d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2d].booleanCase = false;
    init::functionCaseGroups[0x2d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2e].groupName = "refract";
    init::functionCaseGroups[0x2e].func = "refract";
    init::functionCaseGroups[0x2e].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2e].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2e].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x2e].types[3] = F;
    init::functionCaseGroups[0x2e].modifyParamNdx = -1;
    init::functionCaseGroups[0x2e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2e].booleanCase = false;
    init::functionCaseGroups[0x2e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2f].groupName = "matrixCompMult";
    init::functionCaseGroups[0x2f].func = "matrixCompMult";
    init::functionCaseGroups[0x2f].types[0] = M;
    init::functionCaseGroups[0x2f].types[1] = M;
    init::functionCaseGroups[0x2f].types[2] = M;
    init::functionCaseGroups[0x2f].types[3] = N;
    init::functionCaseGroups[0x2f].modifyParamNdx = -1;
    init::functionCaseGroups[0x2f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2f].booleanCase = false;
    init::functionCaseGroups[0x2f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x30].groupName = "lessThan";
    init::functionCaseGroups[0x30].func = "lessThan";
    init::functionCaseGroups[0x30].types[0] = BV;
    init::functionCaseGroups[0x30].types[1] = FV;
    init::functionCaseGroups[0x30].types[2] = FV;
    init::functionCaseGroups[0x30].types[3] = N;
    init::functionCaseGroups[0x30].modifyParamNdx = -1;
    init::functionCaseGroups[0x30].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x30].booleanCase = false;
    init::functionCaseGroups[0x30].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x31].groupName = "lessThanEqual";
    init::functionCaseGroups[0x31].func = "lessThanEqual";
    init::functionCaseGroups[0x31].types[0] = BV;
    init::functionCaseGroups[0x31].types[1] = FV;
    init::functionCaseGroups[0x31].types[2] = FV;
    init::functionCaseGroups[0x31].types[3] = N;
    init::functionCaseGroups[0x31].modifyParamNdx = -1;
    init::functionCaseGroups[0x31].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x31].booleanCase = false;
    init::functionCaseGroups[0x31].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x32].groupName = "greaterThan";
    init::functionCaseGroups[0x32].func = "greaterThan";
    init::functionCaseGroups[0x32].types[0] = BV;
    init::functionCaseGroups[0x32].types[1] = FV;
    init::functionCaseGroups[0x32].types[2] = FV;
    init::functionCaseGroups[0x32].types[3] = N;
    init::functionCaseGroups[0x32].modifyParamNdx = -1;
    init::functionCaseGroups[0x32].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x32].booleanCase = false;
    init::functionCaseGroups[0x32].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x33].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x33].func = "greaterThanEqual";
    init::functionCaseGroups[0x33].types[0] = BV;
    init::functionCaseGroups[0x33].types[1] = FV;
    init::functionCaseGroups[0x33].types[2] = FV;
    init::functionCaseGroups[0x33].types[3] = N;
    init::functionCaseGroups[0x33].modifyParamNdx = -1;
    init::functionCaseGroups[0x33].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x33].booleanCase = false;
    init::functionCaseGroups[0x33].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x34].groupName = "equal";
    init::functionCaseGroups[0x34].func = "equal";
    init::functionCaseGroups[0x34].types[0] = BV;
    init::functionCaseGroups[0x34].types[1] = FV;
    init::functionCaseGroups[0x34].types[2] = FV;
    init::functionCaseGroups[0x34].types[3] = N;
    init::functionCaseGroups[0x34].modifyParamNdx = -1;
    init::functionCaseGroups[0x34].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x34].booleanCase = false;
    init::functionCaseGroups[0x34].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x35].groupName = "notEqual";
    init::functionCaseGroups[0x35].func = "notEqual";
    init::functionCaseGroups[0x35].types[0] = BV;
    init::functionCaseGroups[0x35].types[1] = FV;
    init::functionCaseGroups[0x35].types[2] = FV;
    init::functionCaseGroups[0x35].types[3] = N;
    init::functionCaseGroups[0x35].modifyParamNdx = -1;
    init::functionCaseGroups[0x35].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x35].booleanCase = false;
    init::functionCaseGroups[0x35].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x36].groupName = "lessThan";
    init::functionCaseGroups[0x36].func = "lessThan";
    init::functionCaseGroups[0x36].types[0] = BV;
    init::functionCaseGroups[0x36].types[1] = IV;
    init::functionCaseGroups[0x36].types[2] = IV;
    init::functionCaseGroups[0x36].types[3] = N;
    init::functionCaseGroups[0x36].modifyParamNdx = -1;
    init::functionCaseGroups[0x36].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x36].booleanCase = false;
    init::functionCaseGroups[0x36].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x37].groupName = "lessThanEqual";
    init::functionCaseGroups[0x37].func = "lessThanEqual";
    init::functionCaseGroups[0x37].types[0] = BV;
    init::functionCaseGroups[0x37].types[1] = IV;
    init::functionCaseGroups[0x37].types[2] = IV;
    init::functionCaseGroups[0x37].types[3] = N;
    init::functionCaseGroups[0x37].modifyParamNdx = -1;
    init::functionCaseGroups[0x37].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x37].booleanCase = false;
    init::functionCaseGroups[0x37].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x38].groupName = "greaterThan";
    init::functionCaseGroups[0x38].func = "greaterThan";
    init::functionCaseGroups[0x38].types[0] = BV;
    init::functionCaseGroups[0x38].types[1] = IV;
    init::functionCaseGroups[0x38].types[2] = IV;
    init::functionCaseGroups[0x38].types[3] = N;
    init::functionCaseGroups[0x38].modifyParamNdx = -1;
    init::functionCaseGroups[0x38].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x38].booleanCase = false;
    init::functionCaseGroups[0x38].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x39].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x39].func = "greaterThanEqual";
    init::functionCaseGroups[0x39].types[0] = BV;
    init::functionCaseGroups[0x39].types[1] = IV;
    init::functionCaseGroups[0x39].types[2] = IV;
    init::functionCaseGroups[0x39].types[3] = N;
    init::functionCaseGroups[0x39].modifyParamNdx = -1;
    init::functionCaseGroups[0x39].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x39].booleanCase = false;
    init::functionCaseGroups[0x39].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3a].groupName = "equal";
    init::functionCaseGroups[0x3a].func = "equal";
    init::functionCaseGroups[0x3a].types[0] = BV;
    init::functionCaseGroups[0x3a].types[1] = IV;
    init::functionCaseGroups[0x3a].types[2] = IV;
    init::functionCaseGroups[0x3a].types[3] = N;
    init::functionCaseGroups[0x3a].modifyParamNdx = -1;
    init::functionCaseGroups[0x3a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3a].booleanCase = false;
    init::functionCaseGroups[0x3a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3b].groupName = "notEqual";
    init::functionCaseGroups[0x3b].func = "notEqual";
    init::functionCaseGroups[0x3b].types[0] = BV;
    init::functionCaseGroups[0x3b].types[1] = IV;
    init::functionCaseGroups[0x3b].types[2] = IV;
    init::functionCaseGroups[0x3b].types[3] = N;
    init::functionCaseGroups[0x3b].modifyParamNdx = -1;
    init::functionCaseGroups[0x3b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3b].booleanCase = false;
    init::functionCaseGroups[0x3b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3c].groupName = "equal";
    init::functionCaseGroups[0x3c].func = "equal";
    init::functionCaseGroups[0x3c].types[0] = BV;
    init::functionCaseGroups[0x3c].types[1] = BV;
    init::functionCaseGroups[0x3c].types[2] = BV;
    init::functionCaseGroups[0x3c].types[3] = N;
    init::functionCaseGroups[0x3c].modifyParamNdx = -1;
    init::functionCaseGroups[0x3c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3c].booleanCase = true;
    init::functionCaseGroups[0x3c].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x3d].groupName = "notEqual";
    init::functionCaseGroups[0x3d].func = "notEqual";
    init::functionCaseGroups[0x3d].types[0] = BV;
    init::functionCaseGroups[0x3d].types[1] = BV;
    init::functionCaseGroups[0x3d].types[2] = BV;
    init::functionCaseGroups[0x3d].types[3] = N;
    init::functionCaseGroups[0x3d].modifyParamNdx = -1;
    init::functionCaseGroups[0x3d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3d].booleanCase = true;
    init::functionCaseGroups[0x3d].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x3e].groupName = "any";
    init::functionCaseGroups[0x3e].func = "any";
    init::functionCaseGroups[0x3e].types[0] = B;
    init::functionCaseGroups[0x3e].types[1] = BV;
    init::functionCaseGroups[0x3e].types[2] = N;
    init::functionCaseGroups[0x3e].types[3] = N;
    init::functionCaseGroups[0x3e].modifyParamNdx = -1;
    init::functionCaseGroups[0x3e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3e].booleanCase = true;
    init::functionCaseGroups[0x3e].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x3f].groupName = "all";
    init::functionCaseGroups[0x3f].func = "all";
    init::functionCaseGroups[0x3f].types[0] = B;
    init::functionCaseGroups[0x3f].types[1] = BV;
    init::functionCaseGroups[0x3f].types[2] = N;
    init::functionCaseGroups[0x3f].types[3] = N;
    init::functionCaseGroups[0x3f].modifyParamNdx = -1;
    init::functionCaseGroups[0x3f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3f].booleanCase = true;
    init::functionCaseGroups[0x3f].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x40].groupName = "not";
    init::functionCaseGroups[0x40].func = "not";
    init::functionCaseGroups[0x40].types[0] = BV;
    init::functionCaseGroups[0x40].types[1] = BV;
    init::functionCaseGroups[0x40].types[2] = N;
    init::functionCaseGroups[0x40].types[3] = N;
    init::functionCaseGroups[0x40].modifyParamNdx = -1;
    init::functionCaseGroups[0x40].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x40].booleanCase = true;
    init::functionCaseGroups[0x40].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[1].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[1].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[2].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[2].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[3].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[3].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[4].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[4].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[5].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[6].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[6].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[7].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[7].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[8].parentGroup = (TestCaseGroup *)pTVar6;
    init::functionCaseGroups[8].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[9].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[10].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[10].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0xb].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0xb].attribute = init::functionCaseGroups[9].attribute;
    init::functionCaseGroups[0xc].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0xc].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0xd].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0xd].attribute = init::functionCaseGroups[9].attribute;
    init::functionCaseGroups[0xe].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0xe].attribute = init::functionCaseGroups[9].attribute;
    init::functionCaseGroups[0xf].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0xf].attribute = init::functionCaseGroups[9].attribute;
    init::functionCaseGroups[0x10].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x10].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x11].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x11].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x12].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x12].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x13].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x13].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x14].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x14].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x15].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x15].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x16].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x16].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x17].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x17].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x18].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x18].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x19].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x19].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1a].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1b].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1c].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1d].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1e].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1f].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x1f].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x20].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x20].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x21].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x21].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x22].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x22].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x23].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x23].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x24].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x24].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x25].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x25].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x26].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0x26].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x27].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x27].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x28].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x28].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x29].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x29].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2a].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2b].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2c].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2d].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2e].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2f].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x2f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x30].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x30].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x31].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x31].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x32].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x32].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x33].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x33].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x34].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x34].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x35].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x35].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x36].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x36].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x37].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x37].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x38].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x38].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x39].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x39].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3a].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x3a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3b].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x3b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3c].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x3c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3d].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x3d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3e].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x3e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3f].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x3f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x40].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x40].attribute = init::functionCaseGroups[0].attribute;
    __cxa_guard_release(&init()::functionCaseGroups);
  }
  local_2e8 = (undefined4 *)0x0;
  plStack_2e0 = (long *)0x0;
  local_2f8 = (undefined4 *)0x0;
  plStack_2f0 = (long *)0x0;
  local_298 = (TestNode *)0x2287da8;
  lVar16 = 0;
  local_300 = (TestNode *)0x0;
  local_308 = (TestNode *)0x0;
  do {
    pcVar14 = init::functionCaseGroups[lVar16].groupName;
    local_270 = init::functionCaseGroups[lVar16].func;
    pVVar3 = init::functionCaseGroups[lVar16].attribute;
    local_278 = CONCAT44(local_278._4_4_,init::functionCaseGroups[lVar16].modifyParamNdx);
    local_288 = (long *)CONCAT71(local_288._1_7_,
                                 init::functionCaseGroups[lVar16].useNearlyConstantInputs);
    local_290 = (anon_struct_24_3_2913736f *)
                CONCAT71(local_290._1_7_,init::functionCaseGroups[lVar16].booleanCase);
    local_280 = CONCAT44(local_280._4_4_,init::functionCaseGroups[lVar16].precMask);
    bVar25 = true;
    local_220 = lVar16;
    if ((lVar16 == 0) ||
       (init::functionCaseGroups[lVar16].parentGroup !=
        *(TestCaseGroup **)
         gles2::Functional::anon_unknown_1::AttributeCase::iterate::testValues[lVar16 * 4 + 4].
         m_data)) {
      bVar4 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_268,pcVar14,&local_2ca);
      iVar5 = std::__cxx11::string::compare((char *)local_268);
      bVar25 = iVar5 != 0;
      bVar4 = true;
    }
    if ((bVar4) && (local_268[0] != local_258)) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
    if (bVar25) {
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,local_2a0->m_testCtx,pcVar14,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild
                (&(init::functionCaseGroups[lVar16].parentGroup)->super_TestNode,pTVar6);
      local_300 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_300,local_2a0->m_testCtx,"vertex",
                 glcts::fixed_sample_locations_values + 1);
      local_308 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_308,local_2a0->m_testCtx,"fragment",
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar6,local_300);
      tcu::TestNode::addChild(pTVar6,local_308);
      puVar13 = (undefined4 *)operator_new(4);
      *puVar13 = 1;
      plVar8 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar8 + 1) = 0;
      *(undefined4 *)((long)plVar8 + 0xc) = 0;
      *plVar8 = (long)&PTR__SharedPtrState_021702e8;
      plVar8[2] = (long)puVar13;
      *(undefined4 *)(plVar8 + 1) = 1;
      *(undefined4 *)((long)plVar8 + 0xc) = 1;
      if (plStack_2e0 != plVar8) {
        if (plStack_2e0 != (long *)0x0) {
          LOCK();
          plVar17 = plStack_2e0 + 1;
          *(int *)plVar17 = (int)*plVar17 + -1;
          UNLOCK();
          if ((int)*plVar17 == 0) {
            local_2e8 = (undefined4 *)0x0;
            (**(code **)(*plStack_2e0 + 0x10))();
          }
          LOCK();
          piVar1 = (int *)((long)plStack_2e0 + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (plStack_2e0 != (long *)0x0)) {
            (**(code **)(*plStack_2e0 + 8))();
          }
        }
        LOCK();
        *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)plVar8 + 0xc) = *(int *)((long)plVar8 + 0xc) + 1;
        UNLOCK();
        local_2e8 = puVar13;
        plStack_2e0 = plVar8;
      }
      LOCK();
      plVar17 = plVar8 + 1;
      *(int *)plVar17 = (int)*plVar17 + -1;
      UNLOCK();
      if ((int)*plVar17 == 0) {
        (**(code **)(*plVar8 + 0x10))(plVar8);
      }
      LOCK();
      piVar1 = (int *)((long)plVar8 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      puVar13 = (undefined4 *)operator_new(4);
      *puVar13 = 1;
      plVar8 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar8 + 1) = 0;
      *(undefined4 *)((long)plVar8 + 0xc) = 0;
      *plVar8 = (long)&PTR__SharedPtrState_021702e8;
      plVar8[2] = (long)puVar13;
      *(undefined4 *)(plVar8 + 1) = 1;
      *(undefined4 *)((long)plVar8 + 0xc) = 1;
      if (plStack_2f0 != plVar8) {
        if (plStack_2f0 != (long *)0x0) {
          LOCK();
          plVar17 = plStack_2f0 + 1;
          *(int *)plVar17 = (int)*plVar17 + -1;
          UNLOCK();
          if ((int)*plVar17 == 0) {
            local_2f8 = (undefined4 *)0x0;
            (**(code **)(*plStack_2f0 + 0x10))();
          }
          LOCK();
          piVar1 = (int *)((long)plStack_2f0 + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (plStack_2f0 != (long *)0x0)) {
            (**(code **)(*plStack_2f0 + 8))();
          }
        }
        LOCK();
        *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)plVar8 + 0xc) = *(int *)((long)plVar8 + 0xc) + 1;
        UNLOCK();
        local_2f8 = puVar13;
        plStack_2f0 = plVar8;
      }
      LOCK();
      plVar17 = plVar8 + 1;
      *(int *)plVar17 = (int)*plVar17 + -1;
      UNLOCK();
      if ((int)*plVar17 == 0) {
        (**(code **)(*plVar8 + 0x10))(plVar8);
      }
      LOCK();
      piVar1 = (int *)((long)plVar8 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
    }
    uVar15 = 1;
    uVar24 = 0;
    do {
      iVar5 = *(int *)((long)local_298 + uVar24 * 4);
      bVar25 = true;
      if (iVar5 < 0x100) {
        if (7 < iVar5) {
          if (iVar5 == 8) goto LAB_01005423;
          uVar26 = 1;
          if (iVar5 != 0x40) goto LAB_01005437;
LAB_01005414:
          uVar15 = 2;
          goto LAB_01005430;
        }
        if (iVar5 == 2) goto LAB_01005414;
        uVar26 = 1;
        if (iVar5 == 4) {
          uVar15 = 3;
          goto LAB_01005430;
        }
      }
      else {
        if (0x7ff < iVar5) {
          if (iVar5 == 0x1000) goto LAB_01005423;
          uVar26 = 1;
          if (iVar5 != 0x800) goto LAB_01005437;
          goto LAB_01005414;
        }
        if (iVar5 == 0x100) goto LAB_01005414;
        uVar26 = 1;
        if (iVar5 != 0x200) goto LAB_01005437;
LAB_01005423:
        uVar15 = 1;
LAB_01005430:
        uVar26 = 4;
        bVar25 = false;
      }
LAB_01005437:
    } while ((bVar25) && (bVar25 = uVar24 < 3, uVar24 = uVar24 + 1, bVar25));
    if (uVar15 <= uVar26) {
      do {
        lVar16 = 0;
        do {
          uVar23 = *(uint *)((long)local_298 + lVar16 * 4);
          if (uVar23 == 0) {
            DVar20 = TYPE_INVALID;
          }
          else {
            uVar19 = uVar15;
            if (((uVar23 & 0x1b4e) == 0) && (uVar19 = 3, uVar23 != 0x10)) {
              uVar19 = (uint)(uVar23 == 0x20) * 3 + 1;
            }
            if ((uVar23 & 0x3f) == 0) {
              if ((uVar23 & 0x380) == 0) {
                if ((uVar23 & 0x1c00) == 0) {
                  DVar20 = TYPE_LAST;
                  if (uVar23 != 0x40) goto LAB_010054f4;
                  pDVar18 = init::matrixTypes;
                }
                else {
                  pDVar18 = init()::intTypes;
                }
              }
              else {
                pDVar18 = init()::boolTypes;
              }
            }
            else {
              pDVar18 = init()::floatTypes;
            }
            DVar20 = pDVar18[(int)(~(uint)(uVar23 == 0x40) + uVar19)];
          }
LAB_010054f4:
          aDStack_23c[lVar16 + 1] = DVar20;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_240 = local_22c;
        local_248 = local_234;
        PVar22 = PRECISION_LOWP;
        do {
          if (((uint)local_280 >> (PVar22 & 0x1f) & 1) != 0) {
            if ((char)local_290 == '\0') {
              pcVar14 = glu::getPrecisionName(PVar22);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1f8,pcVar14,&local_2cb);
              plVar8 = (long *)std::__cxx11::string::append((char *)local_1f8);
              local_2c8 = &local_2b8;
              plVar17 = plVar8 + 2;
              if ((long *)*plVar8 == plVar17) {
                local_2b8 = *plVar17;
                lStack_2b0 = plVar8[3];
              }
              else {
                local_2b8 = *plVar17;
                local_2c8 = (long *)*plVar8;
              }
              plStack_2c0 = (long *)plVar8[1];
              *plVar8 = (long)plVar17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
            }
            else {
              local_2c8 = &local_2b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,0x1b32ab9);
            }
            if (((char)local_290 == '\0') && (local_1f8[0] != local_1e8)) {
              operator_delete(local_1f8[0],local_1e8[0] + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_2c8,(long)plStack_2c0);
            uVar24 = 1;
            do {
              DVar20 = aDStack_23c[uVar24 + 1];
              if (DVar20 == TYPE_INVALID) break;
              if ((uVar24 == 1) || (DVar20 != aDStack_23c[uVar24])) {
                if (1 < uVar24) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
                }
                pcVar14 = glu::getDataTypeName(DVar20);
                if (pcVar14 == (char *)0x0) {
                  std::ios::clear((int)&stack0xfffffffffffffcd8 +
                                  (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x180);
                }
                else {
                  sVar11 = strlen(pcVar14);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar14,sVar11);
                }
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != 4);
            uVar23 = 0;
            do {
              pTVar6 = local_308;
              if (uVar23 == 0) {
                pTVar6 = local_300;
              }
              pOVar12 = (OperatorPerformanceCase *)operator_new(0x1f8);
              pCVar2 = (Context *)local_2a0[1]._vptr_TestNode;
              std::__cxx11::stringbuf::str();
              DVar20 = aDStack_23c[1];
              caseType = (CaseType)&local_2f8;
              if (uVar23 == 0) {
                caseType = (CaseType)&local_2e8;
              }
              anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
                        (pOVar12,pCVar2->m_testCtx,pCVar2->m_renderCtx,(char *)local_218,
                         (char *)(ulong)uVar23,caseType,in_stack_fffffffffffffcd8,
                         (InitialCalibrationStorage *)CONCAT44(uVar26,in_stack_fffffffffffffce0));
              (pOVar12->super_TestCase).super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__FunctionCase_02170270;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(pOVar12 + 1),local_270,&local_2c9);
              *(DataType *)&pOVar12[1].super_TestCase.super_TestNode.m_name.field_2 = DVar20;
              *(undefined4 *)
               &pOVar12[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
                   (undefined4)local_278;
              *(undefined1 *)
               ((long)&pOVar12[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
                   = local_288._0_1_;
              lVar16 = 0;
              do {
                *(float *)((long)&pOVar12[1].super_TestCase.super_TestNode.m_description.
                                  _M_string_length + lVar16 * 4) = pVVar3->m_data[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              *(Precision *)
               ((long)&pOVar12[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = PVar22;
              *(undefined8 *)((long)&pOVar12[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
                   local_248;
              *(undefined4 *)((long)&pOVar12[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc)
                   = local_240;
              tcu::TestNode::addChild(pTVar6,(TestNode *)pOVar12);
              if (local_218 != local_208) {
                operator_delete(local_218,local_208[0] + 1);
              }
              bVar25 = uVar23 == 0;
              uVar23 = uVar23 + 1;
            } while (bVar25);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8,local_2b8 + 1);
            }
          }
          PVar22 = PVar22 + PRECISION_MEDIUMP;
        } while (PVar22 != PRECISION_LAST);
        bVar25 = uVar15 != uVar26;
        uVar15 = uVar15 + 1;
      } while (bVar25);
    }
    lVar16 = local_220 + 1;
    local_298 = (TestNode *)((long)local_298 + 0x40);
    if (lVar16 == 0x41) {
      if (plStack_2f0 != (long *)0x0) {
        LOCK();
        plVar8 = plStack_2f0 + 1;
        *(int *)plVar8 = (int)*plVar8 + -1;
        UNLOCK();
        if ((int)*plVar8 == 0) {
          local_2f8 = (undefined4 *)0x0;
          (**(code **)(*plStack_2f0 + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)plStack_2f0 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (plStack_2f0 != (long *)0x0) {
            (**(code **)(*plStack_2f0 + 8))();
          }
          plStack_2f0 = (long *)0x0;
        }
      }
      if (plStack_2e0 != (long *)0x0) {
        LOCK();
        plVar8 = plStack_2e0 + 1;
        *(int *)plVar8 = (int)*plVar8 + -1;
        UNLOCK();
        if ((int)*plVar8 == 0) {
          local_2e8 = (undefined4 *)0x0;
          (**(code **)(*plStack_2e0 + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)plStack_2e0 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (plStack_2e0 != (long *)0x0)) {
          plStack_2e0 = (long *)(**(code **)(*plStack_2e0 + 8))();
        }
      }
      return (int)plStack_2e0;
    }
  } while( true );
}

Assistant:

void ShaderOperatorTests::init (void)
{
	// Binary operator cases

	static const DataType binaryOpTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,
	};
	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};
	static const struct
	{
		const char*		name;
		const char*		op;
		bool			swizzle;
	} binaryOps[] =
	{
		{ "add",		"+",		false	},
		{ "sub",		"-",		true	},
		{ "mul",		"*",		false	},
		{ "div",		"/",		true	}
	};

	tcu::TestCaseGroup* const binaryOpsGroup = new tcu::TestCaseGroup(m_testCtx, "binary_operator", "Binary Operator Performance Tests");
	addChild(binaryOpsGroup);

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(binaryOps); opNdx++)
	{
		tcu::TestCaseGroup* const opGroup = new tcu::TestCaseGroup(m_testCtx, binaryOps[opNdx].name, "");
		binaryOpsGroup->addChild(opGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			const BinaryOpCase::InitialCalibrationStorage	shaderGroupCalibrationStorage	(new BinaryOpCase::InitialCalibration);
			const bool										isVertex						= isFrag == 0;
			tcu::TestCaseGroup* const						shaderGroup						= new tcu::TestCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			opGroup->addChild(shaderGroup);

			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(binaryOpTypes); typeNdx++)
			{
				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					const DataType		type			= binaryOpTypes[typeNdx];
					const Precision		precision		= precisions[precNdx];
					const char* const	op				= binaryOps[opNdx].op;
					const bool			useSwizzle		= binaryOps[opNdx].swizzle;
					std::ostringstream	name;

					name << getPrecisionName(precision) << "_" << getDataTypeName(type);

					shaderGroup->addChild(new BinaryOpCase(m_context, name.str().c_str(), "", op, type, precision, useSwizzle, isVertex, shaderGroupCalibrationStorage));
				}
			}
		}
	}

	// Built-in function cases.

	// Non-specific (i.e. includes gentypes) parameter types for the functions.
	enum ValueType
	{
		VALUE_NONE			= 0,
		VALUE_FLOAT			= (1<<0),	// float scalar
		VALUE_FLOAT_VEC		= (1<<1),	// float vector
		VALUE_FLOAT_VEC34	= (1<<2),	// float vector of size 3 or 4
		VALUE_FLOAT_GENTYPE	= (1<<3),	// float scalar/vector
		VALUE_VEC3			= (1<<4),	// vec3 only
		VALUE_VEC4			= (1<<5),	// vec4 only
		VALUE_MATRIX		= (1<<6),	// matrix
		VALUE_BOOL			= (1<<7),	// boolean scalar
		VALUE_BOOL_VEC		= (1<<8),	// boolean vector
		VALUE_BOOL_GENTYPE	= (1<<9),	// boolean scalar/vector
		VALUE_INT			= (1<<10),	// int scalar
		VALUE_INT_VEC		= (1<<11),	// int vector
		VALUE_INT_GENTYPE	= (1<<12),	// int scalar/vector

		// Shorthands.
		N				= VALUE_NONE,
		F				= VALUE_FLOAT,
		FV				= VALUE_FLOAT_VEC,
		VL				= VALUE_FLOAT_VEC34, // L for "large"
		GT				= VALUE_FLOAT_GENTYPE,
		V3				= VALUE_VEC3,
		V4				= VALUE_VEC4,
		M				= VALUE_MATRIX,
		B				= VALUE_BOOL,
		BV				= VALUE_BOOL_VEC,
		BGT				= VALUE_BOOL_GENTYPE,
		I				= VALUE_INT,
		IV				= VALUE_INT_VEC,
		IGT				= VALUE_INT_GENTYPE,

		VALUE_ANY_FLOAT			= VALUE_FLOAT		|	VALUE_FLOAT_VEC		|	VALUE_FLOAT_GENTYPE	| VALUE_VEC3 | VALUE_VEC4 | VALUE_FLOAT_VEC34,
		VALUE_ANY_INT			= VALUE_INT			|	VALUE_INT_VEC		|	VALUE_INT_GENTYPE,
		VALUE_ANY_BOOL			= VALUE_BOOL		|	VALUE_BOOL_VEC		|	VALUE_BOOL_GENTYPE,

		VALUE_ANY_GENTYPE		= VALUE_FLOAT_VEC	|	VALUE_FLOAT_GENTYPE	|	VALUE_FLOAT_VEC34	|
								  VALUE_BOOL_VEC	|	VALUE_BOOL_GENTYPE	|
								  VALUE_INT_VEC		|	VALUE_INT_GENTYPE	|
								  VALUE_MATRIX
	};
	enum PrecisionMask
	{
		PRECMASK_NA				= 0,						//!< Precision not applicable (booleans)
		PRECMASK_LOWP			= (1<<PRECISION_LOWP),
		PRECMASK_MEDIUMP		= (1<<PRECISION_MEDIUMP),
		PRECMASK_HIGHP			= (1<<PRECISION_HIGHP),

		PRECMASK_MEDIUMP_HIGHP	= (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP),
		PRECMASK_ALL			= (1<<PRECISION_LOWP) | (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP)
	};

	static const DataType floatTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};
	static const DataType intTypes[] =
	{
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4
	};
	static const DataType boolTypes[] =
	{
		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4
	};
	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	tcu::TestCaseGroup* const angleAndTrigonometryGroup		= new tcu::TestCaseGroup(m_testCtx, "angle_and_trigonometry",	"Built-In Angle and Trigonometry Function Performance Tests");
	tcu::TestCaseGroup* const exponentialGroup				= new tcu::TestCaseGroup(m_testCtx, "exponential",				"Built-In Exponential Function Performance Tests");
	tcu::TestCaseGroup* const commonFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "common_functions",			"Built-In Common Function Performance Tests");
	tcu::TestCaseGroup* const geometricFunctionsGroup		= new tcu::TestCaseGroup(m_testCtx, "geometric",				"Built-In Geometric Function Performance Tests");
	tcu::TestCaseGroup* const matrixFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "matrix",					"Built-In Matrix Function Performance Tests");
	tcu::TestCaseGroup* const floatCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "float_compare",			"Built-In Floating Point Comparison Function Performance Tests");
	tcu::TestCaseGroup* const intCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "int_compare",				"Built-In Integer Comparison Function Performance Tests");
	tcu::TestCaseGroup* const boolCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "bool_compare",				"Built-In Boolean Comparison Function Performance Tests");

	addChild(angleAndTrigonometryGroup);
	addChild(exponentialGroup);
	addChild(commonFunctionsGroup);
	addChild(geometricFunctionsGroup);
	addChild(matrixFunctionsGroup);
	addChild(floatCompareGroup);
	addChild(intCompareGroup);
	addChild(boolCompareGroup);

	// Some attributes to be used as parameters for the functions.
	const Vec4 attrPos		= Vec4( 2.3f,  1.9f,  0.8f,  0.7f);
	const Vec4 attrNegPos	= Vec4(-1.3f,  2.5f, -3.5f,	 4.3f);
	const Vec4 attrSmall	= Vec4(-0.9f,  0.8f, -0.4f,	 0.2f);

	// Function name, return type and parameter type information; also, what attribute should be used in the test.
	// \note Different versions of the same function (i.e. with the same group name) can be defined by putting them successively in this array.
	// \note In order to reduce case count and thus total execution time, we don't test all input type combinations for every function.
	static const struct
	{
		tcu::TestCaseGroup*					parentGroup;
		const char*							groupName;
		const char*							func;
		const ValueType						types[FunctionCase::MAX_PARAMS + 1]; // Return type and parameter types, in that order.
		const Vec4&							attribute;
		int									modifyParamNdx;
		bool								useNearlyConstantInputs;
		bool								booleanCase;
		PrecisionMask						precMask;
	} functionCaseGroups[] =
	{
		{ angleAndTrigonometryGroup,	"radians",			"radians",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"degrees",			"degrees",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"sin",				"sin",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"cos",				"cos",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"tan",				"tan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"asin",				"asin",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"acos",				"acos",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan2",			"atan",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan",				"atan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ exponentialGroup,				"pow",				"pow",				{ F,  F,  F,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp",				"exp",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log",				"log",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp2",				"exp2",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log2",				"log2",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"sqrt",				"sqrt",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"inversesqrt",		"inversesqrt",		{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},

		{ commonFunctionsGroup,			"abs",				"abs",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"abs",				"abs",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"sign",				"sign",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"sign",				"sign",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"floor",			"floor",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"floor",			"floor",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"fract",			"fract",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"fract",			"fract",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mod",				"mod",				{ GT, GT, GT, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"min",				"min",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"min",				"min",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"max",				"max",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"max",				"max",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ F,  F,  F,  F  }, attrSmall,		 2, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ V4, V4, V4, V4 }, attrSmall,		 2, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mix",				"mix",				{ F,  F,  F,  F  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"mix",				"mix",				{ V4, V4, V4, V4 }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"step",				"step",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"step",				"step",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ F,  F,  F,  F  }, attrSmall,		 1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ V4, V4, V4, V4 }, attrSmall,		 1, false,	false,	PRECMASK_ALL			},

		{ geometricFunctionsGroup,		"length",			"length",			{ F,  VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"distance",			"distance",			{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"dot",				"dot",				{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"cross",			"cross",			{ V3, V3, V3, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"normalize",		"normalize",		{ VL, VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"faceforward",		"faceforward",		{ VL, VL, VL, VL }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"reflect",			"reflect",			{ VL, VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"refract",			"refract",			{ VL, VL, VL, F  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ matrixFunctionsGroup,			"matrixCompMult",	"matrixCompMult",	{ M,  M,  M,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ floatCompareGroup,			"lessThan",			"lessThan",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"lessThanEqual",	"lessThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThan",		"greaterThan",		{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThanEqual",	"greaterThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"equal",			"equal",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"notEqual",			"notEqual",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ intCompareGroup,				"lessThan",			"lessThan",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"lessThanEqual",	"lessThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThan",		"greaterThan",		{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThanEqual",	"greaterThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"equal",			"equal",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"notEqual",			"notEqual",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ boolCompareGroup,				"equal",			"equal",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"notEqual",			"notEqual",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"any",				"any",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"all",				"all",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"not",				"not",				{ BV, BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		}
	};

	// vertexSubGroup and fragmentSubGroup are the groups where the various vertex/fragment cases of a single function are added.
	// \note These are defined here so that different versions (different entries in the functionCaseGroups array) of the same function can be put in the same group.
	tcu::TestCaseGroup*							vertexSubGroup		= DE_NULL;
	tcu::TestCaseGroup*							fragmentSubGroup	= DE_NULL;
	FunctionCase::InitialCalibrationStorage		vertexSubGroupCalibrationStorage;
	FunctionCase::InitialCalibrationStorage		fragmentSubGroupCalibrationStorage;
	for (int funcNdx = 0; funcNdx < DE_LENGTH_OF_ARRAY(functionCaseGroups); funcNdx++)
	{
		tcu::TestCaseGroup* const	parentGroup					= functionCaseGroups[funcNdx].parentGroup;
		const char* const			groupName					= functionCaseGroups[funcNdx].groupName;
		const char* const			groupFunc					= functionCaseGroups[funcNdx].func;
		const ValueType* const		funcTypes					= functionCaseGroups[funcNdx].types;
		const Vec4&					groupAttribute				= functionCaseGroups[funcNdx].attribute;
		const int					modifyParamNdx				= functionCaseGroups[funcNdx].modifyParamNdx;
		const bool					useNearlyConstantInputs		= functionCaseGroups[funcNdx].useNearlyConstantInputs;
		const bool					booleanCase					= functionCaseGroups[funcNdx].booleanCase;
		const PrecisionMask			precMask					= functionCaseGroups[funcNdx].precMask;

		// If this is a new function and not just a different version of the previously defined function, create a new group.
		if (funcNdx == 0 || parentGroup != functionCaseGroups[funcNdx-1].parentGroup || string(groupName) != functionCaseGroups[funcNdx-1].groupName)
		{
			tcu::TestCaseGroup* const funcGroup = new tcu::TestCaseGroup(m_testCtx, groupName, "");
			functionCaseGroups[funcNdx].parentGroup->addChild(funcGroup);

			vertexSubGroup		= new tcu::TestCaseGroup(m_testCtx, "vertex", "");
			fragmentSubGroup	= new tcu::TestCaseGroup(m_testCtx, "fragment", "");

			funcGroup->addChild(vertexSubGroup);
			funcGroup->addChild(fragmentSubGroup);

			vertexSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
			fragmentSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
		}

		DE_ASSERT(vertexSubGroup != DE_NULL);
		DE_ASSERT(fragmentSubGroup != DE_NULL);

		// Find the type size range of parameters (e.g. from 2 to 4 in case of vectors).
		int genTypeFirstSize	= 1;
		int genTypeLastSize		= 1;

		// Find the first return value or parameter with a gentype (if any) and set sizes accordingly.
		// \note Assumes only matching sizes gentypes are to be found, e.g. no "genType func (vec param)"
		for (int i = 0; i < FunctionCase::MAX_PARAMS + 1 && genTypeLastSize == 1; i++)
		{
			switch (funcTypes[i])
			{
				case VALUE_FLOAT_VEC:
				case VALUE_BOOL_VEC:
				case VALUE_INT_VEC:			// \note Fall-through.
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_VEC34:
					genTypeFirstSize = 3;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_GENTYPE:
				case VALUE_BOOL_GENTYPE:
				case VALUE_INT_GENTYPE:		// \note Fall-through.
					genTypeFirstSize = 1;
					genTypeLastSize = 4;
					break;
				case VALUE_MATRIX:
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				// If none of the above, keep looping.
				default:
					break;
			}
		}

		// Create a case for each possible size of the gentype.
		for (int curSize = genTypeFirstSize; curSize <= genTypeLastSize; curSize++)
		{
			// Determine specific types for return value and the parameters, according to curSize. Non-gentypes not affected by curSize.
			DataType types[FunctionCase::MAX_PARAMS + 1];
			for (int i = 0; i < FunctionCase::MAX_PARAMS + 1; i++)
			{
				if (funcTypes[i] == VALUE_NONE)
					types[i] = TYPE_INVALID;
				else
				{
					int isFloat	= funcTypes[i] & VALUE_ANY_FLOAT;
					int isBool	= funcTypes[i] & VALUE_ANY_BOOL;
					int isInt	= funcTypes[i] & VALUE_ANY_INT;
					int isMat	= funcTypes[i] == VALUE_MATRIX;
					int inSize	= (funcTypes[i] & VALUE_ANY_GENTYPE)	? curSize
								: funcTypes[i] == VALUE_VEC3			? 3
								: funcTypes[i] == VALUE_VEC4			? 4
								: 1;
					int			typeArrayNdx = isMat ? inSize - 2 : inSize - 1; // \note No matrices of size 1.

					types[i]	= isFloat	? floatTypes[typeArrayNdx]
								: isBool	? boolTypes[typeArrayNdx]
								: isInt		? intTypes[typeArrayNdx]
								: isMat		? matrixTypes[typeArrayNdx]
								: TYPE_LAST;
				}

				DE_ASSERT(types[i] != TYPE_LAST);
			}

			// Array for just the parameter types.
			DataType paramTypes[FunctionCase::MAX_PARAMS];
			for (int i = 0; i < FunctionCase::MAX_PARAMS; i++)
				paramTypes[i] = types[i+1];

			for (int prec = (int)PRECISION_LOWP; prec < (int)PRECISION_LAST; prec++)
			{
				if ((precMask & (1 << prec)) == 0)
					continue;

				const string		precisionPrefix = booleanCase ? "" : (string(getPrecisionName((Precision)prec)) + "_");
				std::ostringstream	caseName;

				caseName << precisionPrefix;

				// Write the name of each distinct parameter data type into the test case name.
				for (int i = 1; i < FunctionCase::MAX_PARAMS + 1 && types[i] != TYPE_INVALID; i++)
				{
					if (i == 1 || types[i] != types[i-1])
					{
						if (i > 1)
							caseName << "_";

						caseName << getDataTypeName(types[i]);
					}
				}

				for (int fragI = 0; fragI <= 1; fragI++)
				{
					const bool					vert	= fragI == 0;
					tcu::TestCaseGroup* const	group	= vert ? vertexSubGroup : fragmentSubGroup;
					group->addChild	(new FunctionCase(m_context,
													  caseName.str().c_str(), "",
													  groupFunc,
													  types[0], paramTypes,
													  groupAttribute, modifyParamNdx, useNearlyConstantInputs,
													  (Precision)prec, vert,
													  vert ? vertexSubGroupCalibrationStorage : fragmentSubGroupCalibrationStorage));
				}
			}
		}
	}
}